

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps_compression.cpp
# Opt level: O3

void transpose_xyz_aos_to_soa(char *filename)

{
  int val;
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  uint32_t nr_of_vertices;
  float *vertices_from_xyz;
  float *z;
  float *y;
  float *x;
  float *vertices;
  uint32_t *triangles;
  uint32_t nr_of_triangles;
  uint local_64;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  uint32_t *local_38;
  uint32_t local_2c;
  
  val = trico_read_stl(&local_64,&local_40,&local_2c,&local_38,filename);
  TestEq<int,int>(1,val,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                  ,0x29,"void transpose_xyz_aos_to_soa(const char *)");
  sVar3 = (ulong)local_64 << 2;
  local_48 = (float *)malloc(sVar3);
  local_50 = (float *)malloc(sVar3);
  local_58 = (float *)malloc(sVar3);
  (anonymous_namespace)::g_timer._0_8_ = std::chrono::_V2::system_clock::now();
  trico_transpose_xyz_aos_to_soa(&local_48,&local_50,&local_58,local_40,local_64);
  anon_unknown.dwarf_2833::toc("transpose_xyz_aos_to_soa time: ");
  if (local_64 == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = 2;
    uVar1 = 0;
    do {
      TestEq<float,float>(local_48[uVar1],local_40[uVar2 - 2],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                          ,0x35,"void transpose_xyz_aos_to_soa(const char *)");
      TestEq<float,float>(local_50[uVar1],local_40[uVar2 - 1],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                          ,0x36,"void transpose_xyz_aos_to_soa(const char *)");
      TestEq<float,float>(local_58[uVar1],local_40[uVar2],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                          ,0x37,"void transpose_xyz_aos_to_soa(const char *)");
      uVar1 = uVar1 + 1;
      uVar2 = uVar2 + 3;
    } while (uVar1 < local_64);
    sVar3 = (ulong)local_64 * 0xc;
  }
  local_60 = (float *)malloc(sVar3);
  (anonymous_namespace)::g_timer._0_8_ = std::chrono::_V2::system_clock::now();
  trico_transpose_xyz_soa_to_aos(&local_60,local_48,local_50,local_58,local_64);
  anon_unknown.dwarf_2833::toc("transpose_xyz_soa_to_aos time: ");
  if (local_64 != 0) {
    uVar2 = 2;
    uVar1 = 0;
    do {
      TestEq<float,float>(local_48[uVar1],local_60[uVar2 - 2],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                          ,0x42,"void transpose_xyz_aos_to_soa(const char *)");
      TestEq<float,float>(local_50[uVar1],local_60[uVar2 - 1],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                          ,0x43,"void transpose_xyz_aos_to_soa(const char *)");
      TestEq<float,float>(local_58[uVar1],local_60[uVar2],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                          ,0x44,"void transpose_xyz_aos_to_soa(const char *)");
      uVar1 = uVar1 + 1;
      uVar2 = uVar2 + 3;
    } while (uVar1 < local_64);
  }
  free(local_60);
  free(local_48);
  free(local_50);
  free(local_58);
  free(local_40);
  free(local_38);
  return;
}

Assistant:

void transpose_xyz_aos_to_soa(const char* filename)
  {
  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  float* x = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* y = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* z = (float*)trico_malloc(sizeof(float)*nr_of_vertices);

  tic();
  trico_transpose_xyz_aos_to_soa(&x, &y, &z, vertices, nr_of_vertices);
  toc("transpose_xyz_aos_to_soa time: ");

  for (uint32_t i = 0; i < nr_of_vertices; ++i)
    {
    TEST_EQ(x[i], vertices[i * 3]);
    TEST_EQ(y[i], vertices[i * 3 + 1]);
    TEST_EQ(z[i], vertices[i * 3 + 2]);
    }

  float* vertices_from_xyz = (float*)trico_malloc(sizeof(float)*nr_of_vertices * 3);

  tic();
  trico_transpose_xyz_soa_to_aos(&vertices_from_xyz, x, y, z, nr_of_vertices);
  toc("transpose_xyz_soa_to_aos time: ");

  for (uint32_t i = 0; i < nr_of_vertices; ++i)
    {
    TEST_EQ(x[i], vertices_from_xyz[i * 3]);
    TEST_EQ(y[i], vertices_from_xyz[i * 3 + 1]);
    TEST_EQ(z[i], vertices_from_xyz[i * 3 + 2]);
    }

  trico_free(vertices_from_xyz);
  trico_free(x);
  trico_free(y);
  trico_free(z);
  trico_free(vertices);
  trico_free(triangles);
  }